

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O2

void * uprv_calloc_63(size_t num,size_t size)

{
  void *pvVar1;
  
  pvVar1 = uprv_malloc_63(num * size);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memset(pvVar1,0,num * size);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

U_CAPI void * U_EXPORT2
uprv_calloc(size_t num, size_t size) {
    void *mem = NULL;
    size *= num;
    mem = uprv_malloc(size);
    if (mem) {
        uprv_memset(mem, 0, size);
    }
    return mem;
}